

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O0

void __thiscall
sc_core::sc_port_b<sc_core::sc_event_queue_if>::make_sensitive
          (sc_port_b<sc_core::sc_event_queue_if> *this,sc_thread_handle handle_p,
          sc_event_finder *event_finder_)

{
  sc_event_queue_if *psVar1;
  int iVar2;
  const_reference ppsVar3;
  sc_thread_handle in_RSI;
  sc_thread_handle in_RDI;
  sc_port_base *unaff_retaddr;
  sc_event_queue_if *iface_p;
  int if_i;
  int if_n;
  sc_thread_handle in_stack_ffffffffffffffc8;
  int local_20;
  sc_thread_handle psVar4;
  
  if ((in_RDI->super_sc_process_b).file == (char *)0x0) {
    iVar2 = size((sc_port_b<sc_core::sc_event_queue_if> *)0x223d72);
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      ppsVar3 = std::
                vector<sc_core::sc_event_queue_if_*,_std::allocator<sc_core::sc_event_queue_if_*>_>
                ::operator[]((vector<sc_core::sc_event_queue_if_*,_std::allocator<sc_core::sc_event_queue_if_*>_>
                              *)&(in_RDI->super_sc_process_b).m_active_areset_n,(long)local_20);
      psVar1 = *ppsVar3;
      if (psVar1 == (sc_event_queue_if *)0x0) {
        sc_assertion_failed((char *)in_RDI,(char *)in_stack_ffffffffffffffc8,0);
      }
      psVar4 = in_RSI;
      (**(code **)(*(long *)((long)&psVar1->field_0x0 + *(long *)((long)*psVar1 + -0x30)) + 8))
                ((long)&psVar1->field_0x0 + *(long *)((long)*psVar1 + -0x30));
      sc_port_base::add_static_event((sc_port_base *)in_RDI,in_RSI,(sc_event *)0x223dff);
      in_stack_ffffffffffffffc8 = in_RSI;
      in_RSI = psVar4;
    }
  }
  else {
    sc_port_base::make_sensitive(unaff_retaddr,in_RDI,(sc_event_finder *)in_RSI);
  }
  return;
}

Assistant:

void
sc_port_b<IF>::make_sensitive( sc_thread_handle handle_p,
                  sc_event_finder* event_finder_ ) const
{
    if ( m_bind_info == 0 )
    {
        int if_n = size();
        for ( int if_i = 0; if_i < if_n; if_i++ )
	{
	    IF* iface_p = m_interface_vec[if_i];
	    sc_assert( iface_p != 0 );
	    add_static_event( handle_p, iface_p->default_event() );
	}
    }
    else
    {
        sc_port_base::make_sensitive( handle_p, event_finder_ );
    }
}